

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::CumulativeReporterBase::sectionStarting
          (CumulativeReporterBase *this,SectionInfo *sectionInfo)

{
  pointer ppSVar1;
  SectionNode *pSVar2;
  bool bVar3;
  long lVar4;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  _Var5;
  long lVar6;
  _Alloc_hider _Var7;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  __it;
  SectionNode *node;
  unique_ptr<Catch::CumulativeReporterBase::SectionNode> newNode;
  SectionNode *local_d8;
  unique_ptr<Catch::CumulativeReporterBase::SectionNode> *local_d0;
  vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>>>
  *local_c8;
  SectionInfo local_c0;
  SectionStats local_90;
  
  SectionInfo::SectionInfo(&local_c0,sectionInfo);
  SectionInfo::SectionInfo(&local_90.sectionInfo,&local_c0);
  local_90.durationInSeconds._0_1_ = 0;
  local_90._81_8_ = 0;
  local_90.assertions.failedButOk = 0;
  local_90.assertions.skipped._0_1_ = 0;
  local_90.assertions.skipped._1_7_ = 0;
  local_90.assertions.passed = 0;
  local_90.assertions.failed = 0;
  std::__cxx11::string::~string((string *)&local_c0);
  ppSVar1 = (this->m_sectionStack).
            super__Vector_base<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->m_sectionStack).
      super__Vector_base<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start == ppSVar1) {
    _Var7._M_p = (pointer)(this->m_rootSection).m_ptr;
    local_d8 = (SectionNode *)_Var7._M_p;
    if ((SectionNode *)_Var7._M_p == (SectionNode *)0x0) {
      Detail::make_unique<Catch::CumulativeReporterBase::SectionNode,Catch::SectionStats&>
                ((Detail *)&local_c0,&local_90);
      _Var7._M_p = local_c0.name._M_dataplus._M_p;
      local_c0.name._M_dataplus._M_p = (pointer)0x0;
      Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::reset
                (&this->m_rootSection,(SectionNode *)_Var7._M_p);
      Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::~unique_ptr
                ((unique_ptr<Catch::CumulativeReporterBase::SectionNode> *)&local_c0);
      _Var7._M_p = (pointer)(this->m_rootSection).m_ptr;
      local_d8 = (SectionNode *)_Var7._M_p;
    }
    goto LAB_0015f524;
  }
  pSVar2 = ppSVar1[-1];
  local_c8 = (vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>>>
              *)&pSVar2->childSections;
  __it._M_current =
       (pSVar2->childSections).
       super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_d0 = (pSVar2->childSections).
             super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)local_d0 - (long)__it._M_current;
  local_c0.name._M_dataplus._M_p = (pointer)sectionInfo;
  for (lVar6 = lVar4 >> 5; _Var5._M_current = __it._M_current, 0 < lVar6; lVar6 = lVar6 + -1) {
    bVar3 = __gnu_cxx::__ops::_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo>::operator()
                      ((_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo> *)&local_c0,__it);
    if (bVar3) goto LAB_0015f4e3;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo>::operator()
                      ((_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo> *)&local_c0,
                       __it._M_current + 1);
    _Var5._M_current = __it._M_current + 1;
    if (bVar3) goto LAB_0015f4e3;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo>::operator()
                      ((_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo> *)&local_c0,
                       __it._M_current + 2);
    _Var5._M_current = __it._M_current + 2;
    if (bVar3) goto LAB_0015f4e3;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo>::operator()
                      ((_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo> *)&local_c0,
                       __it._M_current + 3);
    _Var5._M_current = __it._M_current + 3;
    if (bVar3) goto LAB_0015f4e3;
    __it._M_current = __it._M_current + 4;
    lVar4 = lVar4 + -0x20;
  }
  lVar4 = lVar4 >> 3;
  if (lVar4 == 1) {
LAB_0015f55f:
    bVar3 = __gnu_cxx::__ops::_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo>::operator()
                      ((_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo> *)&local_c0,__it);
    _Var5._M_current = local_d0;
    if (bVar3) {
      _Var5._M_current = __it._M_current;
    }
  }
  else if (lVar4 == 2) {
LAB_0015f4b5:
    bVar3 = __gnu_cxx::__ops::_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo>::operator()
                      ((_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo> *)&local_c0,_Var5);
    if (!bVar3) {
      __it._M_current = _Var5._M_current + 1;
      goto LAB_0015f55f;
    }
  }
  else {
    _Var5._M_current = local_d0;
    if ((lVar4 == 3) &&
       (bVar3 = __gnu_cxx::__ops::_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo>::
                operator()((_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo> *)&local_c0,__it
                          ), _Var5._M_current = __it._M_current, !bVar3)) {
      _Var5._M_current = __it._M_current + 1;
      goto LAB_0015f4b5;
    }
  }
LAB_0015f4e3:
  if (_Var5._M_current ==
      (pSVar2->childSections).
      super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    Detail::make_unique<Catch::CumulativeReporterBase::SectionNode,Catch::SectionStats&>
              ((Detail *)&local_c0,&local_90);
    _Var7._M_p = local_c0.name._M_dataplus._M_p;
    local_d8 = (SectionNode *)local_c0.name._M_dataplus._M_p;
    std::
    vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>>>
    ::emplace_back<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>>
              (local_c8,(unique_ptr<Catch::CumulativeReporterBase::SectionNode> *)&local_c0);
    Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::~unique_ptr
              ((unique_ptr<Catch::CumulativeReporterBase::SectionNode> *)&local_c0);
  }
  else {
    _Var7._M_p = (pointer)(_Var5._M_current)->m_ptr;
    local_d8 = (SectionNode *)_Var7._M_p;
  }
LAB_0015f524:
  this->m_deepestSection = (SectionNode *)_Var7._M_p;
  std::
  vector<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
  ::push_back(&this->m_sectionStack,&local_d8);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void
    CumulativeReporterBase::sectionStarting( SectionInfo const& sectionInfo ) {
        // We need a copy, because SectionStats expect to take ownership
        SectionStats incompleteStats( SectionInfo(sectionInfo), Counts(), 0, false );
        SectionNode* node;
        if ( m_sectionStack.empty() ) {
            if ( !m_rootSection ) {
                m_rootSection =
                    Detail::make_unique<SectionNode>( incompleteStats );
            }
            node = m_rootSection.get();
        } else {
            SectionNode& parentNode = *m_sectionStack.back();
            auto it = std::find_if( parentNode.childSections.begin(),
                                    parentNode.childSections.end(),
                                    BySectionInfo( sectionInfo ) );
            if ( it == parentNode.childSections.end() ) {
                auto newNode =
                    Detail::make_unique<SectionNode>( incompleteStats );
                node = newNode.get();
                parentNode.childSections.push_back( CATCH_MOVE( newNode ) );
            } else {
                node = it->get();
            }
        }

        m_deepestSection = node;
        m_sectionStack.push_back( node );
    }